

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O0

void find_ud(opt_state_t *opt_state,block *root)

{
  int iVar1;
  block *local_28;
  block *p;
  int maxlevel;
  int i;
  block *root_local;
  opt_state_t *opt_state_local;
  
  iVar1 = root->level;
  for (p._4_4_ = iVar1; -1 < p._4_4_; p._4_4_ = p._4_4_ + -1) {
    for (local_28 = opt_state->levels[p._4_4_]; local_28 != (block *)0x0; local_28 = local_28->link)
    {
      compute_local_ud(local_28);
      local_28->out_use = 0;
    }
  }
  for (p._4_4_ = 1; p._4_4_ <= iVar1; p._4_4_ = p._4_4_ + 1) {
    for (local_28 = opt_state->levels[p._4_4_]; local_28 != (block *)0x0; local_28 = local_28->link)
    {
      local_28->out_use =
           ((local_28->et).succ)->in_use | ((local_28->ef).succ)->in_use | local_28->out_use;
      local_28->in_use = local_28->out_use & (local_28->kill ^ 0xffffffff) | local_28->in_use;
    }
  }
  return;
}

Assistant:

static void
find_ud(opt_state_t *opt_state, struct block *root)
{
	int i, maxlevel;
	struct block *p;

	/*
	 * root->level is the highest level no found;
	 * count down from there.
	 */
	maxlevel = root->level;
	for (i = maxlevel; i >= 0; --i)
		for (p = opt_state->levels[i]; p; p = p->link) {
			compute_local_ud(p);
			p->out_use = 0;
		}

	for (i = 1; i <= maxlevel; ++i) {
		for (p = opt_state->levels[i]; p; p = p->link) {
			p->out_use |= JT(p)->in_use | JF(p)->in_use;
			p->in_use |= p->out_use &~ p->kill;
		}
	}
}